

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeNF
          (ChElementShellReissner4 *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  char *__function;
  ulong uVar6;
  ulong uVar7;
  
  *detJ = this->m_lenX * this->m_lenY * 0.25;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
LAB_007ac092:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      dVar2 = (U + 1.0) * 0.25;
      pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar6 = 3;
      if ((((ulong)pdVar5 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      dVar3 = dVar2 * (V + 1.0);
      pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          pdVar5[uVar7] = dVar3 * pdVar1[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          pdVar5[uVar6] = dVar3 * pdVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_007ac092;
      if (5 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 3;
        uVar6 = 3;
        if ((((ulong)pdVar5 & 7) == 0) &&
           (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
          uVar6 = uVar7;
        }
        pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        if (uVar6 != 0) {
          uVar7 = 0;
          do {
            pdVar5[uVar7] = dVar3 * pdVar1[uVar7 + 3];
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        if (uVar6 < 3) {
          do {
            pdVar5[uVar6] = dVar3 * pdVar1[uVar6 + 3];
            uVar6 = uVar6 + 1;
          } while (uVar6 != 3);
        }
        if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3
           ) goto LAB_007ac092;
        if (8 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          dVar3 = (1.0 - U) * 0.25;
          pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 6;
          uVar6 = 3;
          if ((((ulong)pdVar5 & 7) == 0) &&
             (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
            uVar6 = uVar7;
          }
          dVar4 = dVar3 * (V + 1.0);
          pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              pdVar5[uVar7] = dVar4 * pdVar1[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          if (uVar6 < 3) {
            do {
              pdVar5[uVar6] = dVar4 * pdVar1[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar6 != 3);
          }
          if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
              6) goto LAB_007ac092;
          if (0xb < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
            pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + 9;
            uVar6 = 3;
            if ((((ulong)pdVar5 & 7) == 0) &&
               (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
              uVar6 = uVar7;
            }
            pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            if (uVar6 != 0) {
              uVar7 = 0;
              do {
                pdVar5[uVar7] = dVar4 * pdVar1[uVar7 + 3];
                uVar7 = uVar7 + 1;
              } while (uVar6 != uVar7);
            }
            if (uVar6 < 3) {
              do {
                pdVar5[uVar6] = dVar4 * pdVar1[uVar6 + 3];
                uVar6 = uVar6 + 1;
              } while (uVar6 != 3);
            }
            if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                < 3) goto LAB_007ac092;
            if (0xe < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_rows) {
              pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 0xc;
              uVar6 = 3;
              if ((((ulong)pdVar5 & 7) == 0) &&
                 (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
                uVar6 = uVar7;
              }
              dVar3 = dVar3 * (1.0 - V);
              pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data;
              if (uVar6 != 0) {
                uVar7 = 0;
                do {
                  pdVar5[uVar7] = dVar3 * pdVar1[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar6 != uVar7);
              }
              if (uVar6 < 3) {
                do {
                  pdVar5[uVar6] = dVar3 * pdVar1[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 3);
              }
              if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows < 6) goto LAB_007ac092;
              if (0x11 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + 0xf;
                uVar6 = 3;
                if ((((ulong)pdVar5 & 7) == 0) &&
                   (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
                  uVar6 = uVar7;
                }
                pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                if (uVar6 != 0) {
                  uVar7 = 0;
                  do {
                    pdVar5[uVar7] = dVar3 * pdVar1[uVar7 + 3];
                    uVar7 = uVar7 + 1;
                  } while (uVar6 != uVar7);
                }
                if (uVar6 < 3) {
                  do {
                    pdVar5[uVar6] = dVar3 * pdVar1[uVar6 + 3];
                    uVar6 = uVar6 + 1;
                  } while (uVar6 != 3);
                }
                if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows < 3) goto LAB_007ac092;
                if (0x14 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows) {
                  pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data + 0x12;
                  uVar6 = 3;
                  if ((((ulong)pdVar5 & 7) == 0) &&
                     (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
                    uVar6 = uVar7;
                  }
                  dVar2 = dVar2 * (1.0 - V);
                  pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
                  if (uVar6 != 0) {
                    uVar7 = 0;
                    do {
                      pdVar5[uVar7] = dVar2 * pdVar1[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar6 != uVar7);
                  }
                  if (uVar6 < 3) {
                    do {
                      pdVar5[uVar6] = dVar2 * pdVar1[uVar6];
                      uVar6 = uVar6 + 1;
                    } while (uVar6 != 3);
                  }
                  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_rows < 6) goto LAB_007ac092;
                  if (0x17 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_rows) {
                    pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data + 0x15;
                    uVar6 = 3;
                    if ((((ulong)pdVar5 & 7) == 0) &&
                       (uVar7 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7), uVar7 < 3))
                    {
                      uVar6 = uVar7;
                    }
                    pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data;
                    if (uVar6 != 0) {
                      uVar7 = 0;
                      do {
                        pdVar5[uVar7] = dVar2 * pdVar1[uVar7 + 3];
                        uVar7 = uVar7 + 1;
                      } while (uVar6 != uVar7);
                    }
                    if (uVar6 < 3) {
                      do {
                        pdVar5[uVar6] = dVar2 * pdVar1[uVar6 + 3];
                        uVar6 = uVar6 + 1;
                      } while (uVar6 != 3);
                    }
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementShellReissner4::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    //***TODO*** exact det of jacobian at u,v
    detJ = GetLengthX() * GetLengthY() / 4.0;  // approximate

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(0) * F.segment(3, 3);

    Qi.segment(6, 3) = N(1) * F.segment(0, 3);
    Qi.segment(9, 3) = N(1) * F.segment(3, 3);

    Qi.segment(12, 3) = N(2) * F.segment(0, 3);
    Qi.segment(15, 3) = N(2) * F.segment(3, 3);

    Qi.segment(18, 3) = N(3) * F.segment(0, 3);
    Qi.segment(21, 3) = N(3) * F.segment(3, 3);
}